

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

bool __thiscall wirehair::Codec::Triangle(Codec *this)

{
  ulong uVar1;
  ulong *puVar2;
  byte bVar3;
  uint8_t uVar4;
  uint8_t y;
  ushort uVar5;
  uint16_t uVar6;
  uint uVar7;
  uint uVar8;
  uint64_t *puVar9;
  uint16_t *puVar10;
  uint8_t *puVar11;
  uint64_t *puVar12;
  uint8_t *puVar13;
  long lVar14;
  bool bVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  ulong local_d0;
  undefined1 auVar41 [32];
  
  uVar7 = this->_first_heavy_column;
  if ((uVar7 <= this->_next_pivot) || (bVar15 = TriangleNonHeavy(this), bVar15)) {
    uVar23 = this->_next_pivot;
    uVar21 = (uint)this->_mix_count + (uint)this->_defer_count;
    bVar15 = uVar21 <= uVar23;
    if (!bVar15) {
      uVar8 = this->_pivot_count;
      iVar16 = (uint)this->_dense_count + (uint)this->_defer_count;
      local_d0 = 1L << ((ulong)uVar23 & 0x3f);
      uVar30 = this->_first_heavy_pivot;
      auVar42 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar47 = ZEXT3264(CONCAT428(0x3f,CONCAT424(0x3f,CONCAT420(0x3f,CONCAT416(0x3f,CONCAT412(0x3f,
                                                  CONCAT48(0x3f,0x3f0000003f)))))));
      auVar43 = vpbroadcastq_avx512f(ZEXT816(0xf));
      auVar48 = ZEXT3264(CONCAT428(0x20,CONCAT424(0x20,CONCAT420(0x20,CONCAT416(0x20,CONCAT412(0x20,
                                                  CONCAT48(0x20,0x2000000020)))))));
      uVar28 = (ulong)uVar23;
      do {
        uVar1 = uVar28 + 1;
        uVar26 = (uint)uVar28;
        uVar23 = uVar26 - uVar7;
        if (uVar28 < uVar30) {
          uVar25 = (uint)(uVar28 >> 6) & 0x3ffffff;
          puVar9 = this->_ge_matrix;
          uVar24 = uVar26 + 1;
          uVar18 = local_d0 >> 0x3f | local_d0 << 1;
          uVar17 = (uVar26 & 0xfffffffc) + 4;
          bVar15 = false;
          uVar22 = uVar28;
          uVar32 = uVar1;
          do {
            puVar10 = this->_pivots;
            uVar5 = puVar10[uVar22 & 0xffffffff];
            uVar27 = this->_ge_pitch;
            uVar19 = (ulong)(uVar27 * uVar5);
            uVar20 = *(ulong *)((long)puVar9 + uVar19 * 8 + (ulong)(uVar25 * 8));
            if ((local_d0 & uVar20) != 0) {
              puVar10[uVar22 & 0xffffffff] = puVar10[uVar28];
              puVar10[uVar28] = uVar5;
              uVar29 = (int)uVar22 + 1;
              uVar31 = (ulong)uVar29;
              if (uVar29 < uVar30) {
                uVar31 = uVar32;
                do {
                  uVar33 = (ulong)(puVar10[uVar31] * uVar27);
                  uVar34 = *(ulong *)((long)puVar9 + uVar33 * 8 + (ulong)(uVar25 * 8));
                  if (((local_d0 & uVar34) != 0) &&
                     (*(ulong *)((long)puVar9 + uVar33 * 8 + (ulong)(uVar25 * 8)) =
                           uVar34 ^ uVar20 & -local_d0 ^ local_d0, 1 < uVar27 - uVar25)) {
                    uVar34 = 1;
                    do {
                      puVar2 = (ulong *)((long)puVar9 +
                                        uVar34 * 8 + uVar33 * 8 + (ulong)(uVar25 * 8));
                      *puVar2 = *puVar2 ^ *(ulong *)((long)puVar9 +
                                                    uVar34 * 8 + uVar19 * 8 + (ulong)(uVar25 * 8));
                      uVar34 = uVar34 + 1;
                    } while (uVar34 < uVar27 - uVar25);
                  }
                  uVar31 = uVar31 + 1;
                } while (uVar31 < uVar30);
              }
              bVar15 = true;
              if ((uint)uVar31 < uVar8) {
                uVar31 = uVar31 & 0xffffffff;
                do {
                  uVar27 = ((uint)this->_pivots[uVar31] - iVar16) * this->_heavy_pitch;
                  puVar11 = this->_heavy_matrix;
                  bVar3 = puVar11[(ulong)uVar23 + (ulong)uVar27];
                  if (bVar3 != 0) {
                    uVar35 = this->_ge_pitch * (uint)uVar5;
                    puVar12 = this->_ge_matrix;
                    uVar19 = local_d0;
                    uVar29 = uVar24;
                    uVar36 = uVar24;
                    switch(uVar26 & 3) {
                    case 0:
                      uVar19 = uVar18;
                      uVar29 = uVar26 + 2;
                      if ((puVar12[(ulong)uVar35 + (ulong)(uVar24 >> 6)] & uVar18) != 0) {
                        puVar11[(ulong)(uVar24 - this->_first_heavy_column) + (ulong)uVar27] =
                             puVar11[(ulong)(uVar24 - this->_first_heavy_column) + (ulong)uVar27] ^
                             bVar3;
                      }
                    case 1:
                      uVar19 = uVar19 >> 0x3f | uVar19 << 1;
                      if ((puVar12[(ulong)uVar35 + (ulong)(uVar29 >> 6)] & uVar19) != 0) {
                        puVar11[(ulong)(uVar29 - this->_first_heavy_column) + (ulong)uVar27] =
                             puVar11[(ulong)(uVar29 - this->_first_heavy_column) + (ulong)uVar27] ^
                             bVar3;
                      }
                      uVar29 = uVar29 + 1;
                    case 2:
                      uVar36 = uVar17;
                      if ((puVar12[(ulong)uVar35 + (ulong)(uVar29 >> 6)] &
                          (uVar19 >> 0x3f | uVar19 << 1)) != 0) {
                        puVar11[(ulong)(uVar29 - this->_first_heavy_column) + (ulong)uVar27] =
                             puVar11[(ulong)(uVar29 - this->_first_heavy_column) + (ulong)uVar27] ^
                             bVar3;
                      }
                    case 3:
                      if (uVar36 < uVar21) {
                        lVar14 = ((ulong)uVar36 - (ulong)uVar7) + (ulong)uVar27;
                        uVar27 = uVar36 + 4;
                        if (uVar36 + 4 < uVar21) {
                          uVar27 = uVar21;
                        }
                        auVar37 = vpbroadcastd_avx512vl();
                        auVar37 = vpaddd_avx2(auVar37,_DAT_001096c0);
                        auVar44 = vpbroadcastq_avx512f();
                        auVar38 = vpbroadcastd_avx512vl();
                        uVar19 = 0;
                        do {
                          auVar45 = vpbroadcastq_avx512f();
                          auVar45 = vporq_avx512f(auVar45,auVar42);
                          uVar34 = vpcmpuq_avx512f(auVar45,auVar44,2);
                          vpsrld_avx2(auVar37,6);
                          auVar45 = vpgatherdq_avx512f((int)puVar12[(long)&this->_block_bytes +
                                                                    (ulong)uVar35]);
                          bVar3 = (byte)uVar34;
                          auVar46._8_8_ = (ulong)((byte)(uVar34 >> 1) & 1) * auVar45._8_8_;
                          auVar46._0_8_ = (ulong)(bVar3 & 1) * auVar45._0_8_;
                          auVar46._16_8_ = (ulong)((byte)(uVar34 >> 2) & 1) * auVar45._16_8_;
                          auVar46._24_8_ = (ulong)((byte)(uVar34 >> 3) & 1) * auVar45._24_8_;
                          auVar46._32_8_ = (ulong)((byte)(uVar34 >> 4) & 1) * auVar45._32_8_;
                          auVar46._40_8_ = (ulong)((byte)(uVar34 >> 5) & 1) * auVar45._40_8_;
                          auVar46._48_8_ = (ulong)((byte)(uVar34 >> 6) & 1) * auVar45._48_8_;
                          auVar46._56_8_ = (uVar34 >> 7) * auVar45._56_8_;
                          auVar39 = vpand_avx2(auVar37,auVar47._0_32_);
                          auVar45 = vpmovzxdq_avx512f(auVar39);
                          auVar45 = vpsrlvq_avx512f(auVar46,auVar45);
                          vpandq_avx512f(auVar45,auVar43);
                          auVar39 = vpgatherqd_avx512f(*(undefined8 *)
                                                        (GF256_MULT_LOOKUP + (long)this * 4));
                          auVar40._4_4_ = (uint)((byte)(uVar34 >> 1) & 1) * auVar39._4_4_;
                          auVar40._0_4_ = (uint)(bVar3 & 1) * auVar39._0_4_;
                          auVar40._8_4_ = (uint)((byte)(uVar34 >> 2) & 1) * auVar39._8_4_;
                          auVar40._12_4_ = (uint)((byte)(uVar34 >> 3) & 1) * auVar39._12_4_;
                          auVar40._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * auVar39._16_4_;
                          auVar40._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * auVar39._20_4_;
                          auVar40._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * auVar39._24_4_;
                          auVar40._28_4_ = (uint)(byte)(uVar34 >> 7) * auVar39._28_4_;
                          auVar39 = vpmulld_avx2(auVar40,auVar38);
                          auVar40 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                        (puVar11 + uVar19 * 4 + lVar14));
                          auVar41._4_4_ = (uint)((byte)(uVar34 >> 1) & 1) * auVar40._4_4_;
                          auVar41._0_4_ = (uint)(bVar3 & 1) * auVar40._0_4_;
                          auVar41._8_4_ = (uint)((byte)(uVar34 >> 2) & 1) * auVar40._8_4_;
                          auVar41._12_4_ = (uint)((byte)(uVar34 >> 3) & 1) * auVar40._12_4_;
                          auVar41._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * auVar40._16_4_;
                          auVar41._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * auVar40._20_4_;
                          auVar41._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * auVar40._24_4_;
                          auVar41._28_4_ = (uint)(byte)(uVar34 >> 7) * auVar40._28_4_;
                          auVar39 = vmovdqu32_avx512vl(auVar41 ^ auVar39);
                          *(undefined1 (*) [32])(puVar11 + uVar19 * 4 + lVar14) = auVar39;
                          uVar19 = uVar19 + 8;
                          auVar37 = vpaddd_avx2(auVar48._0_32_,auVar37);
                        } while (((~uVar36 + uVar27 >> 2) + 8 & 0xfffffff8) != uVar19);
                      }
                    }
                  }
                  uVar31 = uVar31 + 1;
                } while (uVar31 != uVar8);
              }
            }
            if ((local_d0 & uVar20) != 0) goto LAB_0010465f;
            uVar27 = (int)uVar22 + 1;
            uVar22 = (ulong)uVar27;
            uVar32 = uVar32 + 1;
          } while (uVar27 < uVar30);
          uVar22 = (ulong)uVar30;
        }
        else {
          bVar15 = false;
          uVar22 = uVar28 & 0xffffffff;
        }
LAB_0010465f:
        if ((!bVar15) && ((uint)uVar22 < this->_pivot_count)) {
          uVar25 = uVar23 + 1;
          uVar32 = uVar22 & 0xffffffff;
          do {
            uVar32 = uVar32 + 1;
            puVar10 = this->_pivots;
            uVar18 = uVar22 & 0xffffffff;
            uVar5 = puVar10[uVar18];
            uVar17 = ((uint)uVar5 - iVar16) * this->_heavy_pitch;
            puVar11 = this->_heavy_matrix;
            uVar4 = puVar11[(ulong)uVar23 + (ulong)uVar17];
            if (uVar4 != '\0') {
              puVar10[uVar18] = puVar10[uVar28];
              puVar10[uVar28] = uVar5;
              uVar20 = (ulong)uVar30;
              if (uVar28 < uVar20) {
                uVar6 = puVar10[uVar20];
                puVar10[uVar20] = puVar10[uVar18];
                puVar10[uVar18] = uVar6;
                uVar30 = uVar30 + 1;
              }
              bVar15 = true;
              if ((int)uVar22 + 1U < uVar8) {
                uVar18 = uVar32;
                do {
                  uVar24 = ((uint)this->_pivots[uVar18] - iVar16) * this->_heavy_pitch;
                  puVar13 = this->_heavy_matrix;
                  if (puVar13[(ulong)uVar23 + (ulong)uVar24] != '\0') {
                    y = GF256Ctx.GF256_DIV_TABLE
                        [CONCAT11(uVar4,puVar13[(ulong)uVar23 + (ulong)uVar24])];
                    puVar13[(ulong)uVar23 + (ulong)uVar24] = y;
                    gf256_muladd_mem(puVar13 + (ulong)uVar25 + (ulong)uVar24,y,
                                     puVar11 + (ulong)uVar25 + (ulong)uVar17,
                                     this->_heavy_columns - uVar25);
                    auVar48 = ZEXT3264(CONCAT428(0x20,CONCAT424(0x20,CONCAT420(0x20,CONCAT416(0x20,
                                                  CONCAT412(0x20,CONCAT48(0x20,0x2000000020)))))));
                    auVar43 = vpbroadcastq_avx512f(ZEXT816(0xf));
                    auVar47 = ZEXT3264(CONCAT428(0x3f,CONCAT424(0x3f,CONCAT420(0x3f,CONCAT416(0x3f,
                                                  CONCAT412(0x3f,CONCAT48(0x3f,0x3f0000003f)))))));
                    auVar42 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar18 < uVar8);
                bVar15 = true;
              }
            }
          } while ((uVar4 == '\0') &&
                  (uVar17 = (int)uVar22 + 1, uVar22 = (ulong)uVar17, uVar17 < this->_pivot_count));
        }
        if (!bVar15) {
          this->_next_pivot = uVar26;
          this->_first_heavy_pivot = uVar30;
          goto LAB_00104802;
        }
        local_d0 = local_d0 >> 0x3f | local_d0 << 1;
        bVar15 = uVar21 <= uVar1;
        uVar28 = uVar1;
      } while (uVar1 != uVar21);
    }
  }
  else {
LAB_00104802:
    bVar15 = false;
  }
  return bVar15;
}

Assistant:

bool Codec::Triangle()
{
    CAT_IF_DUMP(cout << endl << "---- Triangle ----" << endl << endl;)

    const unsigned first_heavy_column = _first_heavy_column;

    // If next pivot is not heavy:
    if (_next_pivot < first_heavy_column &&
        !TriangleNonHeavy())
    {
        return false;
    }

    const unsigned pivot_count = _pivot_count;
    const unsigned column_count = _defer_count + _mix_count;
    const unsigned first_heavy_row = _defer_count + _dense_count;
    unsigned first_heavy_pivot = _first_heavy_pivot;

    uint64_t ge_mask = (uint64_t)1 << (_next_pivot & 63);

    // For each heavy pivot to determine:
    for (unsigned pivot_i = _next_pivot; pivot_i < column_count;
        ++pivot_i, ge_mask = CAT_ROL64(ge_mask, 1))
    {
        CAT_DEBUG_ASSERT(pivot_i >= first_heavy_column);
        const unsigned heavy_col_i = pivot_i - first_heavy_column;

        const unsigned word_offset = pivot_i >> 6;
        uint64_t * GF256_RESTRICT ge_matrix_offset = _ge_matrix + word_offset;
        bool found = false;
        unsigned pivot_j;

        // For each remaining GE row that might be the pivot:
        for (pivot_j = pivot_i; pivot_j < first_heavy_pivot; ++pivot_j)
        {
            const unsigned ge_row_j = _pivots[pivot_j];
            uint64_t * GF256_RESTRICT ge_row = &ge_matrix_offset[_ge_pitch * ge_row_j];

            // If the bit was not found:
            if (0 == (*ge_row & ge_mask)) {
                continue; // Skip to next
            }

            // Found it!
            found = true;

            CAT_IF_DUMP(cout << "Pivot " << pivot_i << " found on row " << ge_row_j << endl;)

            // Swap out the pivot index for this one
            _pivots[pivot_j] = _pivots[pivot_i];
            CAT_DEBUG_ASSERT(ge_row_j < _pivot_count);
            _pivots[pivot_i] = (uint16_t)ge_row_j;

            // Prepare masked first word
            const uint64_t row0 = (*ge_row & ~(ge_mask - 1)) ^ ge_mask;

            unsigned pivot_k = pivot_j + 1;

            // For each remaining light row:
            for (; pivot_k < first_heavy_pivot; ++pivot_k)
            {
                // Determine if the row contains the bit we want
                unsigned ge_row_k = _pivots[pivot_k];
                uint64_t * GF256_RESTRICT rem_row = &ge_matrix_offset[_ge_pitch * ge_row_k];

                // If the bit was found:
                if (0 != (*rem_row & ge_mask))
                {
                    // Unroll first word to handle masked word and for speed
                    *rem_row ^= row0;

                    // Add the pivot row to eliminate the bit from this row, preserving previous bits
                    for (unsigned ii = 1, end = _ge_pitch - word_offset; ii < end; ++ii) {
                        rem_row[ii] ^= ge_row[ii];
                    }
                }
            } // next remaining row

            // For each remaining heavy row:
            for (; pivot_k < pivot_count; ++pivot_k)
            {
                CAT_DEBUG_ASSERT(_pivots[pivot_k] >= first_heavy_row);
                const unsigned heavy_row_k = _pivots[pivot_k] - first_heavy_row;

                uint8_t * GF256_RESTRICT rem_row = &_heavy_matrix[_heavy_pitch * heavy_row_k];
                const uint8_t code_value = rem_row[heavy_col_i];

                // If the column is non-zero:
                if (0 == code_value) {
                    continue;
                }

                CAT_IF_DUMP(cout << "Eliminating from heavy row " << heavy_row_k << " :";)

                // For each set bit in the binary pivot row, add rem[i] to rem[i+]:
                uint64_t * GF256_RESTRICT pivot_row = &_ge_matrix[_ge_pitch * ge_row_j];

#if !defined(CAT_HEAVY_WIN_MULT)
                for (unsigned ge_column_i = pivot_i + 1; ge_column_i < column_count; ++ge_column_i)
                {
                    const uint64_t mask = (uint64_t)1 << (ge_column_i & 63);
                    const uint64_t word = pivot_row[ge_column_i >> 6];
                    const bool nonzero = 0 != (word & mask);

                    if (nonzero) {
                        rem_row[ge_column_i - first_heavy_column] ^= code_value;
                    }
                }
#else // CAT_HEAVY_WIN_MULT
                const unsigned odd_count = pivot_i & 3;
                unsigned ge_column_i = pivot_i + 1;
                uint64_t temp_mask = ge_mask;

                // Unroll odd columns:
                switch (odd_count)
                {
                case 0: temp_mask = CAT_ROL64(temp_mask, 1);
                        if (0 != (pivot_row[ge_column_i >> 6] & temp_mask))
                        {
                            CAT_DEBUG_ASSERT(ge_column_i >= _first_heavy_column);
                            rem_row[ge_column_i - _first_heavy_column] ^= code_value;
                            CAT_IF_DUMP(cout << " " << ge_column_i;)
                        }
                        ++ge_column_i;

                        // Fall-thru...
                case 1: temp_mask = CAT_ROL64(temp_mask, 1);
                        if (0 != (pivot_row[ge_column_i >> 6] & temp_mask))
                        {
                            CAT_DEBUG_ASSERT(ge_column_i >= _first_heavy_column);
                            rem_row[ge_column_i - _first_heavy_column] ^= code_value;
                            CAT_IF_DUMP(cout << " " << ge_column_i;)
                        }
                        ++ge_column_i;

                        // Fall-thru...
                case 2: temp_mask = CAT_ROL64(temp_mask, 1);
                        if (0 != (pivot_row[ge_column_i >> 6] & temp_mask))
                        {
                            CAT_DEBUG_ASSERT(ge_column_i >= _first_heavy_column);
                            rem_row[ge_column_i - _first_heavy_column] ^= code_value;
                            CAT_IF_DUMP(cout << " " << ge_column_i;)
                        }

                        // Set GE column to next even column
                        CAT_DEBUG_ASSERT(odd_count <= 4);
                        ge_column_i = pivot_i + (4 - odd_count);
                }

                uint32_t * GF256_RESTRICT word = reinterpret_cast<uint32_t*>(rem_row + ge_column_i - first_heavy_column);

                // For remaining aligned columns:
                for (; ge_column_i < column_count; ge_column_i += 4, ++word)
                {
                    // Look up 4 bit window
                    const uint32_t bits = (uint32_t)(pivot_row[ge_column_i >> 6] >> (ge_column_i & 63)) & 15;
#if defined(CAT_ENDIAN_UNKNOWN)
                    const uint32_t window = getLE(GF256_MULT_LOOKUP[bits]);
#else
                    const uint32_t window = GF256_MULT_LOOKUP[bits];
#endif

                    CAT_IF_DUMP(cout << " " << ge_column_i << "x" << hex << setw(8) << setfill('0') << window << dec;)

                    *word ^= window * code_value;
                }
#endif // CAT_HEAVY_WIN_MULT
                CAT_IF_DUMP(cout << endl;)
            } // next heavy row

            break;
        } // next row

        // If not found, then for each remaining heavy pivot:
        // NOTE: The pivot array maintains the heavy rows at the end so that they are always tried last
        if (!found) for (; pivot_j < _pivot_count; ++pivot_j)
        {
            const unsigned ge_row_j = _pivots[pivot_j];
            CAT_DEBUG_ASSERT(ge_row_j >= first_heavy_row);
            const unsigned heavy_row_j = ge_row_j - first_heavy_row;
            CAT_DEBUG_ASSERT(heavy_row_j < _heavy_rows);
            uint8_t * GF256_RESTRICT pivot_row = &_heavy_matrix[_heavy_pitch * heavy_row_j];
            const uint8_t code_value = pivot_row[heavy_col_i];

            // If heavy row doesn't have the pivot:
            if (0 == code_value) {
                continue; // Skip to next
            }

            // Found it! (common case)
            found = true;

            CAT_IF_DUMP(cout << "Pivot " << pivot_i << " found on heavy row " << ge_row_j << endl;)

            // Swap pivot i and j
            _pivots[pivot_j] = _pivots[pivot_i];
            _pivots[pivot_i] = (uint16_t)ge_row_j;

            // If a non-heavy pivot just got moved into heavy pivot list:
            if (pivot_i < first_heavy_pivot)
            {
                // Swap pivot j with first heavy pivot
                const uint16_t temp = _pivots[first_heavy_pivot];
                _pivots[first_heavy_pivot] = _pivots[pivot_j];
                _pivots[pivot_j] = temp;

                // And move the first heavy pivot up one to cover the hole
                ++first_heavy_pivot;
            }

            unsigned pivot_k = pivot_j + 1;

            // If there are any remaining rows:
            if (pivot_k < pivot_count)
            {
                // For each remaining unused row:
                // Note all remaining rows are heavy rows by pivot array organization
                for (; pivot_k < pivot_count; ++pivot_k)
                {
                    const unsigned ge_row_k = _pivots[pivot_k];
                    CAT_DEBUG_ASSERT(ge_row_k >= first_heavy_row);
                    const unsigned heavy_row_k = ge_row_k - first_heavy_row;
                    CAT_DEBUG_ASSERT(heavy_row_k < _heavy_rows);
                    uint8_t * GF256_RESTRICT rem_row = &_heavy_matrix[_heavy_pitch * heavy_row_k];
                    const uint8_t rem_value = rem_row[heavy_col_i];

                    // If the column is zero:
                    if (0 == rem_value) {
                        continue; // Skip it
                    }

                    // x = rem_value / code_value
                    const uint8_t x = gf256_div(rem_value, code_value);

                    // Store value for later
                    rem_row[heavy_col_i] = x;

                    const unsigned offset = heavy_col_i + 1;
                    CAT_DEBUG_ASSERT(_heavy_columns >= offset);

                    // rem[i+] += x * pivot[i+]
                    gf256_muladd_mem(
                        rem_row + offset,
                        x,
                        pivot_row + offset,
                        _heavy_columns - offset);
                } // next remaining row
            }

            break;
        } // next heavy row

        // If pivot could not be found:
        if (!found)
        {
            _next_pivot = pivot_i;
            _first_heavy_pivot = first_heavy_pivot;

            CAT_IF_DUMP(cout << "Singular: Pivot " << pivot_i << " of " <<
                (_defer_count + _mix_count) << " not found!" << endl;)

            CAT_IF_PIVOT(if (pivot_i + 16 < (unsigned)(_defer_count + _mix_count)) {
                cout << ">>>>> Singular: Pivot " << pivot_i << " of " <<
                    (_defer_count + _mix_count) << " not found!" << endl << endl;
            })

            return false;
        }

        CAT_IF_DUMP( PrintGEMatrix(); )
        CAT_IF_DUMP( PrintExtraMatrix(); )
    }

    return true;
}